

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_option.hpp
# Opt level: O3

void __thiscall
duckdb::CSVOption<duckdb::StrpTimeFormat>::CSVOption
          (CSVOption<duckdb::StrpTimeFormat> *this,CSVOption<duckdb::StrpTimeFormat> *param_1)

{
  this->set_by_user = param_1->set_by_user;
  *(code **)&this->value = duckdb::Relation::Except;
  *(undefined1 **)&this->field_0x10 = &this->field_0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->field_0x10,*(long *)&param_1->field_0x10,
             *(long *)&param_1->field_0x18 + *(long *)&param_1->field_0x10);
  std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::vector
            ((vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> *)
             &this->field_0x30,
             (vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> *)
             &param_1->field_0x30);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->field_0x48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&param_1->field_0x48);
  *(undefined8 *)&this->field_0x60 = *(undefined8 *)&param_1->field_0x60;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&this->field_0x68,
             (vector<int,_std::allocator<int>_> *)&param_1->field_0x68);
  *(code **)&this->value = AdbcConnectionRelease;
  return;
}

Assistant:

CSVOption(T value_p) : value(value_p) { // NOLINT: allow implicit conversion from value
	}